

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_101a1b1::HandleGetWarningMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  PolicyID pid;
  PolicyID local_74;
  string local_70;
  undefined8 local_50;
  char *local_48;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    bVar2 = cmPolicies::GetPolicyID(pbVar1[1]._M_dataplus._M_p,&local_74);
    if (bVar2) {
      this = status->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)(ulong)local_74,id);
      value._M_str = local_70._M_dataplus._M_p;
      value._M_len = local_70._M_string_length;
      cmMakefile::AddDefinition(this,pbVar1 + 2,value);
      local_40.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      local_40._M_dataplus._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar2;
      }
    }
    else {
      local_70.field_2._8_8_ = pbVar1[1]._M_dataplus._M_p;
      local_70.field_2._M_allocated_capacity = pbVar1[1]._M_string_length;
      local_70._M_dataplus._M_p = (char *)0x1a;
      local_70._M_string_length = 0x77ef20;
      local_50 = 0x2e;
      local_48 = "\" which is not known to this version of CMake.";
      views._M_len = 3;
      views._M_array = (iterator)&local_70;
      cmCatViews_abi_cxx11_(&local_40,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return bVar2;
      }
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"GET_WARNING must be given exactly 2 additional arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HandleGetWarningMode(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      "GET_WARNING must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    status.SetError(
      cmStrCat("GET_WARNING given policy \"", id,
               "\" which is not known to this version of CMake."));
    return false;
  }

  // Lookup the policy warning.
  status.GetMakefile().AddDefinition(var, cmPolicies::GetPolicyWarning(pid));

  return true;
}